

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_JumpIfMasterCloser
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  int iVar1;
  AActor *target;
  bool bVar2;
  bool local_3b;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x50a,
                  "int AF_A_JumpIfMasterCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (DObject *)(param->field_0).field_1.a;
    local_3b = true;
    if (this != (DObject *)0x0) {
      local_3b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_3b != false) {
      target = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this[0xe].ObjectFlags);
      iVar1 = DoJumpIfCloser(target,stack,param,numparam,ret,numret);
      return iVar1;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x50a,
                  "int AF_A_JumpIfMasterCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x50a,
                "int AF_A_JumpIfMasterCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfMasterCloser)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfCloser(self->master, VM_ARGS_NAMES);
}